

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O1

void ssh1_terminal_size(ConnectionLayer *cl,int width,int height)

{
  *(int *)&cl[-10].vt = width;
  *(int *)((long)&cl[-10].vt + 4) = height;
  if (cl[-0xb].vt == (ConnectionLayerVtable *)0x0) {
    return;
  }
  return;
}

Assistant:

static void ssh1_terminal_size(ConnectionLayer *cl, int width, int height)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);

    s->term_width = width;
    s->term_height = height;
    if (s->mainchan)
        mainchan_terminal_size(s->mainchan, width, height);
}